

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::InitRcc(cmQtAutoGenInitializer *this)

{
  bool bVar1;
  long lVar2;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string stdOut;
  cmQtAutoGenInitializer *this_local;
  
  stdOut.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"rcc",&local_59);
  bVar1 = GetQtExecutable(this,&(this->Rcc).super_GenVarsT,&local_58,false,(string *)local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if (((this->QtVersion).Major == 5) || ((this->QtVersion).Major == 6)) {
      lVar2 = std::__cxx11::string::find(local_38,0x7bf6cd);
      if (lVar2 == -1) {
        lVar2 = std::__cxx11::string::find(local_38,0x7bf6ce);
        if (lVar2 != -1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[6]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &(this->Rcc).ListOptions,(char (*) [6])0x7bf6ce);
        }
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[7]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &(this->Rcc).ListOptions,(char (*) [7])"--list");
      }
    }
    bVar1 = false;
  }
  else {
    this_local._7_1_ = 0;
    bVar1 = true;
  }
  std::__cxx11::string::~string((string *)local_38);
  if (!bVar1) {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenInitializer::InitRcc()
{
  // Rcc executable
  {
    std::string stdOut;
    if (!this->GetQtExecutable(this->Rcc, "rcc", false, &stdOut)) {
      return false;
    }
    // Evaluate test output
    if (this->QtVersion.Major == 5 || this->QtVersion.Major == 6) {
      if (stdOut.find("--list") != std::string::npos) {
        this->Rcc.ListOptions.emplace_back("--list");
      } else if (stdOut.find("-list") != std::string::npos) {
        this->Rcc.ListOptions.emplace_back("-list");
      }
    }
  }

  return true;
}